

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::VerifyInputFilesInDescriptors
          (CommandLineInterface *this,DescriptorDatabase *database)

{
  pointer pbVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  pointer pbVar5;
  FileDescriptorProto file_descriptor;
  FileDescriptorProto FStack_128;
  
  pbVar5 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pbVar5 == pbVar1) {
      return true;
    }
    FileDescriptorProto::FileDescriptorProto(&FStack_128,(Arena *)0x0);
    iVar2 = (*database->_vptr_DescriptorDatabase[2])(database,pbVar5,&FStack_128);
    if ((char)iVar2 == '\0') break;
    if ((this->disallow_services_ == true) &&
       (0 < FStack_128.field_0._impl_.service_.super_RepeatedPtrFieldBase.current_size_)) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,
                          *(char **)((ulong)FStack_128.field_0._impl_.name_.tagged_ptr_.ptr_ &
                                    0xfffffffffffffffc),
                          ((undefined8 *)
                          ((ulong)FStack_128.field_0._impl_.name_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc))[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,": This file contains services, but --disallow_services was used.",0x40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      goto LAB_0018c1f9;
    }
    FileDescriptorProto::~FileDescriptorProto(&FStack_128);
    pbVar5 = pbVar5 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Could not find file in descriptor database: ",0x2c);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  __s = strerror(2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
LAB_0018c1f9:
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  FileDescriptorProto::~FileDescriptorProto(&FStack_128);
  return false;
}

Assistant:

bool IsFieldCompatible(const FieldDescriptor& field,
                       FieldOptions::OptionTargetType target_type) {
  const RepeatedField<int>& allowed_targets = field.options().targets();
  return allowed_targets.empty() ||
         absl::c_linear_search(allowed_targets, target_type);
}